

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O0

int __thiscall
CVmUndo::add_new_record_ptr_key(CVmUndo *this,vm_obj_id_t obj,void *key,vm_val_t *val)

{
  CVmUndoRecord *pCVar1;
  undefined8 *in_RCX;
  anon_union_8_3_1a28d0a0_for_id in_RDX;
  vm_obj_id_t in_ESI;
  CVmUndo *in_RDI;
  CVmUndoRecord *rec;
  
  pCVar1 = add_new_record(in_RDI,in_ESI);
  if (pCVar1 != (CVmUndoRecord *)0x0) {
    pCVar1->obj = in_ESI;
    pCVar1->id = in_RDX;
    *(undefined8 *)&pCVar1->oldval = *in_RCX;
    (pCVar1->oldval).val = *(anon_union_8_8_cb74652f_for_val *)(in_RCX + 1);
  }
  return (int)(pCVar1 != (CVmUndoRecord *)0x0);
}

Assistant:

int CVmUndo::add_new_record_ptr_key(VMG_ vm_obj_id_t obj, void *key,
                                    const vm_val_t *val)
{
    CVmUndoRecord *rec;

    /* allocate the new record */
    rec = add_new_record(vmg_ obj);

    /* if we successfully allocated a record, set it up */
    if (rec != 0)
    {
        /* set the object */
        rec->obj = obj;

        /* set the key */
        rec->id.ptrval = key;

        /* set the value */
        rec->oldval = *val;
    }

    /* return an indication as to whether the record was created */
    return (rec != 0);
}